

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_partition.h
# Opt level: O0

size_t embree::
       parallel_partitioning<unsigned_int,unsigned_long,int,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::__0,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::__1,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::__2>
                 (uint *array,size_t begin,size_t end,int *identity,unsigned_long *leftReduction,
                 unsigned_long *rightReduction,anon_class_8_1_a8a30a3a *is_left,
                 anon_class_1_0_00000001 *reduction_t,anon_class_1_0_00000001 *reduction_v,
                 size_t BLOCK_SIZE)

{
  anon_class_8_1_898bcfc2_conflict5 *paVar1;
  size_t sVar2;
  size_t sVar3;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  *puVar4;
  bool bVar5;
  int iVar6;
  long *plVar7;
  pointer ppVar8;
  runtime_error *prVar9;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint64_t *in_R8;
  uint64_t *in_R9;
  anon_class_8_1_a8a30a3a *in_stack_00000008;
  anon_class_1_0_00000001 *in_stack_00000010;
  long in_stack_00000018;
  ulong in_stack_00000020;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  p;
  uint *r;
  uint *l;
  range<long> right_misplaced;
  range<long> left_misplaced;
  range<long> right_range;
  range<long> left_range;
  size_t i_2;
  size_t numMisplacedItemsRight;
  size_t numMisplacedItemsLeft;
  size_t numMisplacedRangesRight;
  size_t numMisplacedRangesLeft;
  range<long> globalRight;
  range<long> globalLeft;
  size_t i_1;
  size_t mid;
  size_t i;
  uint tmp;
  task_group_context context;
  task_group_context context_1;
  pointer in_stack_fffffffffffffa38;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  *in_stack_fffffffffffffa40;
  kind_type in_stack_fffffffffffffa4c;
  task_group_context *in_stack_fffffffffffffa50;
  undefined7 in_stack_fffffffffffffa60;
  undefined1 in_stack_fffffffffffffa67;
  anon_class_8_1_898bcfc2_conflict5 *in_stack_fffffffffffffa68;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  *in_stack_fffffffffffffa70;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  **in_stack_fffffffffffffa78;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  *in_stack_fffffffffffffa80;
  long local_578;
  long *local_528;
  long *local_518;
  ulong local_510;
  ulong local_508;
  byte local_4d6;
  bool local_4d5;
  size_t local_490;
  uint *local_488;
  uint *local_480;
  long *local_3e0;
  pointer local_3d8;
  long *local_3d0;
  long *local_3c8;
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  *local_3a0;
  long local_398;
  long local_390;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  *local_388;
  anon_class_8_1_898bcfc2_conflict5 *local_380;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  *local_378;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  *local_370;
  anon_class_8_1_898bcfc2_conflict5 *local_368;
  ulong local_360;
  long local_358;
  long local_350;
  long local_348;
  long local_340;
  anon_class_8_1_898bcfc2_conflict5 *local_338;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  *local_330;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  *local_328 [2];
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  *local_318;
  undefined8 local_310;
  undefined8 local_308;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  *local_300;
  ulong local_2f8;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  *local_2f0;
  ulong local_2e8;
  pointer local_2e0;
  uint64_t *local_2d8;
  uint64_t *local_2d0;
  pointer local_2c8;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  *local_2c0;
  uint local_2b4;
  uint *local_2b0;
  uint *local_2a8;
  long *local_2a0;
  long *local_298;
  pointer *local_280;
  pointer *local_1f8;
  size_t local_1f0;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  **local_1e8;
  long *local_1e0;
  long *local_1d8;
  anon_class_8_1_898bcfc2_conflict5 **local_1d0;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  **local_1c8;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  **local_1c0;
  anon_class_8_1_898bcfc2_conflict5 **local_1b8;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  **local_1b0;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  **local_1a8;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  **local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  anon_class_8_1_898bcfc2_conflict5 *local_188;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  *local_180;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  **local_178;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  **local_170;
  undefined1 *local_168;
  anon_class_8_1_898bcfc2_conflict5 **local_160;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  **local_158;
  undefined1 *local_150;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  *local_148;
  long local_140;
  long *local_138;
  undefined8 *local_130;
  undefined1 *local_128;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  **local_120;
  long *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  long **local_d8;
  long **local_50;
  size_t local_48;
  long local_40;
  long local_38;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  *local_30;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  *local_28;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  *local_20;
  unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  *local_18;
  anon_class_8_1_898bcfc2_conflict5 *local_10;
  
  if ((ulong)(in_RDX - in_RSI) < in_stack_00000020) {
    local_480 = (uint *)(in_RDI + in_RSI * 4);
    local_488 = (uint *)(in_RDI + in_RDX * 4);
    while( true ) {
      local_488 = local_488 + -1;
      while( true ) {
        local_4d5 = false;
        if (local_480 <= local_488) {
          local_4d5 = parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12::
                      anon_class_8_1_a8a30a3a::operator()(in_stack_00000008,(ulong)*local_480);
        }
        if (local_4d5 == false) break;
        parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12::anon_class_1_0_00000001::
        operator()(in_stack_00000010,in_R8,*local_480);
        local_480 = local_480 + 1;
      }
      while( true ) {
        local_4d6 = 0;
        if (local_480 <= local_488) {
          bVar5 = parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12::
                  anon_class_8_1_a8a30a3a::operator()(in_stack_00000008,(ulong)*local_488);
          local_4d6 = bVar5 ^ 0xff;
        }
        if ((local_4d6 & 1) == 0) break;
        parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12::anon_class_1_0_00000001::
        operator()(in_stack_00000010,in_R9,*local_488);
        local_488 = local_488 + -1;
      }
      if (local_488 < local_480) break;
      parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12::anon_class_1_0_00000001::
      operator()(in_stack_00000010,in_R8,*local_488);
      parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12::anon_class_1_0_00000001::
      operator()(in_stack_00000010,in_R9,*local_480);
      local_2a8 = local_480;
      local_2b0 = local_488;
      local_2b4 = *local_480;
      *local_480 = *local_488;
      *local_488 = local_2b4;
      local_480 = local_480 + 1;
    }
    local_490 = (long)local_480 - in_RDI >> 2;
  }
  else {
    plVar7 = (long *)parallel_partition_task<unsigned_int,unsigned_long,int,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::$_0,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::$_1,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::$_2>
                     ::operator_new(0x1d9edc);
    *plVar7 = in_RDI + in_RSI * 4;
    plVar7[1] = in_RDX - in_RSI;
    plVar7[2] = (long)in_stack_00000008;
    plVar7[3] = (long)in_stack_00000010;
    plVar7[4] = in_stack_00000018;
    plVar7[5] = in_RCX;
    local_510 = ((in_RDX - in_RSI) + -1 + in_stack_00000020) / in_stack_00000020;
    iVar6 = tbb::detail::d1::max_concurrency();
    local_508 = (ulong)iVar6;
    if (0x3f < local_508) {
      local_508 = 0x40;
    }
    if (local_508 <= local_510) {
      local_510 = local_508;
    }
    plVar7[6] = local_510;
    local_518 = plVar7 + 0x98;
    do {
      local_298 = local_518;
      local_518 = local_518 + 2;
    } while (local_518 != plVar7 + 0x118);
    local_528 = plVar7 + 0x118;
    do {
      local_2a0 = local_528;
      local_528 = local_528 + 2;
    } while (local_528 != plVar7 + 0x198);
    std::
    unique_ptr<embree::parallel_partition_task<unsigned_int,unsigned_long,int,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::$_0,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::$_1,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::$_2>,std::default_delete<embree::parallel_partition_task<unsigned_int,unsigned_long,int,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::$_0,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::$_1,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::$_2>>>
    ::
    unique_ptr<std::default_delete<embree::parallel_partition_task<unsigned_int,unsigned_long,int,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::__0,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::__1,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::__2>>,void>
              (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
    ppVar8 = std::
             unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:27:40),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:28:40),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:27:40),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:28:40),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:29:40)>_>_>
             ::operator->((unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
                           *)0x1da19a);
    local_1f0 = ppVar8->numTasks;
    local_1f8 = &local_2e0;
    local_2e0 = ppVar8;
    local_2d8 = in_R9;
    local_2d0 = in_R8;
    local_2c8 = ppVar8;
    tbb::detail::d1::task_group_context::task_group_context
              (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4c,
               (uintptr_t)in_stack_fffffffffffffa40);
    local_280 = local_1f8;
    tbb::detail::d1::
    parallel_for<unsigned_long,embree::parallel_for<unsigned_long,embree::parallel_partition_task<unsigned_int,unsigned_long,int,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::__0,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::__1,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::__2>::partition(unsigned_long&,unsigned_long&)::_lambda(unsigned_long)_1_>(unsigned_long,embree::parallel_partition_task<unsigned_int,unsigned_long,int,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::__0,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::__1,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::__2>::partition(unsigned_long&,unsigned_long&)::_lambda(unsigned_long)_1_const&)::_lambda(unsigned_long)_1_>
              ((unsigned_long)in_stack_fffffffffffffa80,(unsigned_long)in_stack_fffffffffffffa78,
               (unsigned_long)in_stack_fffffffffffffa70,
               (anon_class_8_1_898bcfc2_conflict4 *)in_stack_fffffffffffffa68,
               (task_group_context *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60));
    bVar5 = tbb::detail::d1::task_group_context::is_group_execution_cancelled
                      ((task_group_context *)0x1da256);
    if (bVar5) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar9,"task cancelled");
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)0x1da311);
    ppVar8->counter_start[ppVar8->numTasks] = ppVar8->N;
    ppVar8->counter_left[ppVar8->numTasks] = 0;
    for (local_2e8 = 0; local_2e8 < ppVar8->numTasks; local_2e8 = local_2e8 + 1) {
      parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12::anon_class_1_0_00000001::
      operator()(ppVar8->reduction_v,local_2d0,ppVar8->leftReductions[local_2e8]);
      parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12::anon_class_1_0_00000001::
      operator()(ppVar8->reduction_v,local_2d8,ppVar8->rightReductions[local_2e8]);
    }
    local_2f0 = (unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
                 *)ppVar8->counter_left[0];
    for (local_2f8 = 1; local_2f8 < ppVar8->numTasks; local_2f8 = local_2f8 + 1) {
      local_2f0 = (unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
                   *)((long)&(local_2f0->_M_t).
                             super___uniq_ptr_impl<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_*,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
                             .
                             super__Head_base<0UL,_embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_*,_false>
                             ._M_head_impl + ppVar8->counter_left[local_2f8]);
    }
    local_310 = 0;
    local_318 = local_2f0;
    local_190 = &local_308;
    local_198 = &local_310;
    local_1a0 = &local_318;
    local_308 = 0;
    local_300 = local_2f0;
    local_330 = local_2f0;
    paVar1 = (anon_class_8_1_898bcfc2_conflict5 *)ppVar8->N;
    local_1a8 = local_328;
    local_1b0 = &local_330;
    local_1b8 = &local_338;
    local_328[0] = local_2f0;
    local_340 = 0;
    local_348 = 0;
    local_350 = 0;
    local_358 = 0;
    for (local_360 = 0; local_360 < ppVar8->numTasks; local_360 = local_360 + 1) {
      local_378 = (unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
                   *)ppVar8->counter_start[local_360];
      sVar2 = ppVar8->counter_start[local_360];
      sVar3 = ppVar8->counter_left[local_360];
      local_1c0 = &local_370;
      local_1c8 = &local_378;
      local_1d0 = &local_380;
      local_10 = local_380;
      local_398 = ppVar8->counter_start[local_360] + ppVar8->counter_left[local_360];
      puVar4 = (unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
                *)ppVar8->counter_start[local_360 + 1];
      local_1d8 = &local_390;
      local_1e0 = &local_398;
      local_1e8 = &local_3a0;
      local_20 = local_3a0;
      local_128 = local_3b0;
      local_130 = &local_308;
      local_138 = &local_390;
      local_38 = 0;
      local_578 = local_38;
      if (0 < local_398) {
        local_578 = local_398;
      }
      local_140 = local_578;
      in_stack_fffffffffffffa80 = local_3a0;
      if ((long)local_2f0 < (long)local_3a0) {
        in_stack_fffffffffffffa80 = local_2f0;
      }
      local_110 = local_3b0;
      local_118 = &local_140;
      local_120 = &local_148;
      local_168 = local_3c0;
      in_stack_fffffffffffffa78 = local_328;
      local_178 = &local_370;
      local_28 = local_2f0;
      in_stack_fffffffffffffa70 = local_2f0;
      if ((long)local_2f0 < (long)local_378) {
        in_stack_fffffffffffffa70 = local_378;
      }
      in_stack_fffffffffffffa68 = local_380;
      if ((long)local_338 < (long)local_380) {
        in_stack_fffffffffffffa68 = local_338;
      }
      local_150 = local_3c0;
      local_158 = &local_180;
      local_160 = &local_188;
      local_100 = local_3b0;
      if (local_578 < (long)local_148) {
        local_f0 = local_3b0;
        local_350 = (long)local_148 + (local_350 - local_578);
        ppVar8->leftMisplacedRanges[local_340]._begin = local_578;
        ppVar8->leftMisplacedRanges[local_340]._end = (long)local_148;
        local_340 = local_340 + 1;
      }
      local_108 = local_3c0;
      if ((long)in_stack_fffffffffffffa70 < (long)local_188) {
        local_f8 = local_3c0;
        local_358 = (long)local_188 + (local_358 - (long)in_stack_fffffffffffffa70);
        ppVar8->rightMisplacedRanges[local_348]._begin = (long)in_stack_fffffffffffffa70;
        ppVar8->rightMisplacedRanges[local_348]._end = (long)local_188;
        local_348 = local_348 + 1;
      }
      local_3a0 = puVar4;
      local_380 = (anon_class_8_1_898bcfc2_conflict5 *)(sVar2 + sVar3);
      local_188 = in_stack_fffffffffffffa68;
      local_180 = in_stack_fffffffffffffa70;
      local_170 = in_stack_fffffffffffffa78;
      local_148 = in_stack_fffffffffffffa80;
      local_40 = local_398;
      local_30 = local_378;
      local_18 = local_300;
      local_390 = local_398;
      local_388 = local_20;
      local_370 = local_378;
      local_368 = local_10;
    }
    local_338 = paVar1;
    if (local_350 != 0) {
      local_48 = ppVar8->numTasks;
      local_3e0 = &local_350;
      local_3d0 = &local_340;
      local_3c8 = &local_348;
      local_50 = &local_3e0;
      local_3d8 = ppVar8;
      tbb::detail::d1::task_group_context::task_group_context
                (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4c,
                 (uintptr_t)in_stack_fffffffffffffa40);
      local_d8 = local_50;
      tbb::detail::d1::
      parallel_for<unsigned_long,embree::parallel_for<unsigned_long,embree::parallel_partition_task<unsigned_int,unsigned_long,int,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::__0,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::__1,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::__2>::partition(unsigned_long&,unsigned_long&)::_lambda(unsigned_long)_2_>(unsigned_long,embree::parallel_partition_task<unsigned_int,unsigned_long,int,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::__0,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::__1,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::__2>::partition(unsigned_long&,unsigned_long&)::_lambda(unsigned_long)_2_const&)::_lambda(unsigned_long)_1_>
                ((unsigned_long)in_stack_fffffffffffffa80,(unsigned_long)in_stack_fffffffffffffa78,
                 (unsigned_long)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
                 (task_group_context *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60)
                );
      bVar5 = tbb::detail::d1::task_group_context::is_group_execution_cancelled
                        ((task_group_context *)0x1dab4b);
      if (bVar5) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar9,"task cancelled");
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)0x1dac06);
    }
    local_490 = (long)&(local_2f0->_M_t).
                       super___uniq_ptr_impl<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_*,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
                       .
                       super__Head_base<0UL,_embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_*,_false>
                       ._M_head_impl + in_RSI;
    local_2c0 = local_2f0;
    std::
    unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:27:40),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:28:40),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:27:40),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:28:40),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:29:40)>_>_>
    ::~unique_ptr(local_2f0);
  }
  return local_490;
}

Assistant:

__noinline size_t parallel_partitioning(T* array, 
                                            const size_t begin,
                                            const size_t end, 
                                            const Vi &identity,
                                            V &leftReduction,
                                            V &rightReduction,
                                            const IsLeft& is_left, 
                                            const Reduction_T& reduction_t,
                                            const Reduction_V& reduction_v,
                                            size_t BLOCK_SIZE = 128)
  {
    /* fall back to single threaded partitioning for small N */
    if (unlikely(end-begin < BLOCK_SIZE))
      return serial_partitioning(array,begin,end,leftReduction,rightReduction,is_left,reduction_t);

    /* otherwise use parallel code */
    else {
      typedef parallel_partition_task<T,V,Vi,IsLeft,Reduction_T,Reduction_V> partition_task;
      std::unique_ptr<partition_task> p(new partition_task(&array[begin],end-begin,identity,is_left,reduction_t,reduction_v,BLOCK_SIZE));
      return begin+p->partition(leftReduction,rightReduction);    
    }
  }